

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuickSort.h
# Opt level: O1

void JsUtil::
     QuickSort<Memory::_no_write_barrier_policy,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileMemory.cpp:311:42)>
     ::Sort(undefined8 *base,ulong nmemb)

{
  ulong uVar1;
  undefined8 uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
LAB_002ced7e:
  if (base != (undefined8 *)0x0) {
    if (9 < nmemb) goto code_r0x002ced91;
    switch(nmemb) {
    case 3:
      iVar3 = PAL_wcscmp((char16_t *)base[1],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[1];
        base[1] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[2],(char16_t *)base[1]);
      if (iVar3 < 0) {
        uVar2 = base[1];
        base[1] = base[2];
        base[2] = uVar2;
      }
    case 2:
      iVar3 = PAL_wcscmp((char16_t *)base[1],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[1];
        base[1] = uVar2;
        return;
      }
      return;
    case 4:
      iVar3 = PAL_wcscmp((char16_t *)base[1],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[1];
        base[1] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[3],(char16_t *)base[2]);
      if (iVar3 < 0) {
        uVar2 = base[2];
        base[2] = base[3];
        base[3] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[2],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[2];
        base[2] = uVar2;
      }
      break;
    case 5:
      iVar3 = PAL_wcscmp((char16_t *)base[1],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[1];
        base[1] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[4],(char16_t *)base[3]);
      if (iVar3 < 0) {
        uVar2 = base[3];
        base[3] = base[4];
        base[4] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[4],(char16_t *)base[2]);
      if (iVar3 < 0) {
        uVar2 = base[2];
        base[2] = base[4];
        base[4] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[3],(char16_t *)base[2]);
      if (iVar3 < 0) {
        uVar2 = base[2];
        base[2] = base[3];
        base[3] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[3],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[3];
        base[3] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[2],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[2];
        base[2] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[4],(char16_t *)base[1]);
      if (iVar3 < 0) {
        uVar2 = base[1];
        base[1] = base[4];
        base[4] = uVar2;
      }
      break;
    case 6:
      iVar3 = PAL_wcscmp((char16_t *)base[2],(char16_t *)base[1]);
      if (iVar3 < 0) {
        uVar2 = base[1];
        base[1] = base[2];
        base[2] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[2],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[2];
        base[2] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[1],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[1];
        base[1] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[5],(char16_t *)base[4]);
      if (iVar3 < 0) {
        uVar2 = base[4];
        base[4] = base[5];
        base[5] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[5],(char16_t *)base[3]);
      if (iVar3 < 0) {
        uVar2 = base[3];
        base[3] = base[5];
        base[5] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[4],(char16_t *)base[3]);
      if (iVar3 < 0) {
        uVar2 = base[3];
        base[3] = base[4];
        base[4] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[3],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[3];
        base[3] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[4],(char16_t *)base[1]);
      if (iVar3 < 0) {
        uVar2 = base[1];
        base[1] = base[4];
        base[4] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[5],(char16_t *)base[2]);
      if (iVar3 < 0) {
        uVar2 = base[2];
        base[2] = base[5];
        base[5] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[4],(char16_t *)base[2]);
      if (iVar3 < 0) {
        uVar2 = base[2];
        base[2] = base[4];
        base[4] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[3],(char16_t *)base[1]);
      if (iVar3 < 0) {
        uVar2 = base[1];
        base[1] = base[3];
        base[3] = uVar2;
      }
      goto LAB_002cf88a;
    case 7:
      iVar3 = PAL_wcscmp((char16_t *)base[2],(char16_t *)base[1]);
      if (iVar3 < 0) {
        uVar2 = base[1];
        base[1] = base[2];
        base[2] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[2],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[2];
        base[2] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[1],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[1];
        base[1] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[4],(char16_t *)base[3]);
      if (iVar3 < 0) {
        uVar2 = base[3];
        base[3] = base[4];
        base[4] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[6],(char16_t *)base[5]);
      if (iVar3 < 0) {
        uVar2 = base[5];
        base[5] = base[6];
        base[6] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[5],(char16_t *)base[3]);
      if (iVar3 < 0) {
        uVar2 = base[3];
        base[3] = base[5];
        base[5] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[6],(char16_t *)base[4]);
      if (iVar3 < 0) {
        uVar2 = base[4];
        base[4] = base[6];
        base[6] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[5],(char16_t *)base[4]);
      if (iVar3 < 0) {
        uVar2 = base[4];
        base[4] = base[5];
        base[5] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[4],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[4];
        base[4] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[3],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[3];
        base[3] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[5],(char16_t *)base[1]);
      if (iVar3 < 0) {
        uVar2 = base[1];
        base[1] = base[5];
        base[5] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[6],(char16_t *)base[2]);
      if (iVar3 < 0) {
        uVar2 = base[2];
        base[2] = base[6];
        base[6] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[5],(char16_t *)base[2]);
      if (iVar3 < 0) {
        uVar2 = base[2];
        base[2] = base[5];
        base[5] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[3],(char16_t *)base[1]);
      if (iVar3 < 0) {
        uVar2 = base[1];
        base[1] = base[3];
        base[3] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[4],(char16_t *)base[2]);
      if (iVar3 < 0) {
        uVar2 = base[2];
        base[2] = base[4];
        base[4] = uVar2;
      }
LAB_002cf88a:
      iVar3 = PAL_wcscmp((char16_t *)base[3],(char16_t *)base[2]);
      if (iVar3 < 0) {
        uVar2 = base[2];
        base[2] = base[3];
        base[3] = uVar2;
        return;
      }
      return;
    case 8:
      iVar3 = PAL_wcscmp((char16_t *)base[1],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[1];
        base[1] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[3],(char16_t *)base[2]);
      if (iVar3 < 0) {
        uVar2 = base[2];
        base[2] = base[3];
        base[3] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[2],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[2];
        base[2] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[3],(char16_t *)base[1]);
      if (iVar3 < 0) {
        uVar2 = base[1];
        base[1] = base[3];
        base[3] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[2],(char16_t *)base[1]);
      if (iVar3 < 0) {
        uVar2 = base[1];
        base[1] = base[2];
        base[2] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[5],(char16_t *)base[4]);
      if (iVar3 < 0) {
        uVar2 = base[4];
        base[4] = base[5];
        base[5] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[7],(char16_t *)base[6]);
      if (iVar3 < 0) {
        uVar2 = base[6];
        base[6] = base[7];
        base[7] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[6],(char16_t *)base[4]);
      if (iVar3 < 0) {
        uVar2 = base[4];
        base[4] = base[6];
        base[6] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[7],(char16_t *)base[5]);
      if (iVar3 < 0) {
        uVar2 = base[5];
        base[5] = base[7];
        base[7] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[6],(char16_t *)base[5]);
      if (iVar3 < 0) {
        uVar2 = base[5];
        base[5] = base[6];
        base[6] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[4],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[4];
        base[4] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[5],(char16_t *)base[1]);
      if (iVar3 < 0) {
        uVar2 = base[1];
        base[1] = base[5];
        base[5] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[4],(char16_t *)base[1]);
      if (iVar3 < 0) {
        uVar2 = base[1];
        base[1] = base[4];
        base[4] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[6],(char16_t *)base[2]);
      if (iVar3 < 0) {
        uVar2 = base[2];
        base[2] = base[6];
        base[6] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[7],(char16_t *)base[3]);
      if (iVar3 < 0) {
        uVar2 = base[3];
        base[3] = base[7];
        base[7] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[6],(char16_t *)base[3]);
      if (iVar3 < 0) {
        uVar2 = base[3];
        base[3] = base[6];
        base[6] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[4],(char16_t *)base[2]);
      if (iVar3 < 0) {
        uVar2 = base[2];
        base[2] = base[4];
        base[4] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[5],(char16_t *)base[3]);
      if (iVar3 < 0) {
        uVar2 = base[3];
        base[3] = base[5];
        base[5] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[4],(char16_t *)base[3]);
      if (iVar3 < 0) {
        uVar2 = base[3];
        base[3] = base[4];
        base[4] = uVar2;
        return;
      }
      return;
    case 9:
      iVar3 = PAL_wcscmp((char16_t *)base[1],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[1];
        base[1] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[4],(char16_t *)base[3]);
      if (iVar3 < 0) {
        uVar2 = base[3];
        base[3] = base[4];
        base[4] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[7],(char16_t *)base[6]);
      if (iVar3 < 0) {
        uVar2 = base[6];
        base[6] = base[7];
        base[7] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[2],(char16_t *)base[1]);
      if (iVar3 < 0) {
        uVar2 = base[1];
        base[1] = base[2];
        base[2] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[5],(char16_t *)base[4]);
      if (iVar3 < 0) {
        uVar2 = base[4];
        base[4] = base[5];
        base[5] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[8],(char16_t *)base[7]);
      if (iVar3 < 0) {
        uVar2 = base[7];
        base[7] = base[8];
        base[8] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[1],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[1];
        base[1] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[4],(char16_t *)base[3]);
      if (iVar3 < 0) {
        uVar2 = base[3];
        base[3] = base[4];
        base[4] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[7],(char16_t *)base[6]);
      if (iVar3 < 0) {
        uVar2 = base[6];
        base[6] = base[7];
        base[7] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[3],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[3];
        base[3] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[6],(char16_t *)base[3]);
      if (iVar3 < 0) {
        uVar2 = base[3];
        base[3] = base[6];
        base[6] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[3],(char16_t *)*base);
      if (iVar3 < 0) {
        uVar2 = *base;
        *base = base[3];
        base[3] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[4],(char16_t *)base[1]);
      if (iVar3 < 0) {
        uVar2 = base[1];
        base[1] = base[4];
        base[4] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[7],(char16_t *)base[4]);
      if (iVar3 < 0) {
        uVar2 = base[4];
        base[4] = base[7];
        base[7] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[4],(char16_t *)base[1]);
      if (iVar3 < 0) {
        uVar2 = base[1];
        base[1] = base[4];
        base[4] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[5],(char16_t *)base[2]);
      if (iVar3 < 0) {
        uVar2 = base[2];
        base[2] = base[5];
        base[5] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[8],(char16_t *)base[5]);
      if (iVar3 < 0) {
        uVar2 = base[5];
        base[5] = base[8];
        base[8] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[5],(char16_t *)base[2]);
      if (iVar3 < 0) {
        uVar2 = base[2];
        base[2] = base[5];
        base[5] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[3],(char16_t *)base[1]);
      if (iVar3 < 0) {
        uVar2 = base[1];
        base[1] = base[3];
        base[3] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[7],(char16_t *)base[5]);
      if (iVar3 < 0) {
        uVar2 = base[5];
        base[5] = base[7];
        base[7] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[6],(char16_t *)base[2]);
      if (iVar3 < 0) {
        uVar2 = base[2];
        base[2] = base[6];
        base[6] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[6],(char16_t *)base[4]);
      if (iVar3 < 0) {
        uVar2 = base[4];
        base[4] = base[6];
        base[6] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[4],(char16_t *)base[2]);
      if (iVar3 < 0) {
        uVar2 = base[2];
        base[2] = base[4];
        base[4] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[3],(char16_t *)base[2]);
      if (iVar3 < 0) {
        uVar2 = base[2];
        base[2] = base[3];
        base[3] = uVar2;
      }
      iVar3 = PAL_wcscmp((char16_t *)base[6],(char16_t *)base[5]);
      if (iVar3 < 0) {
        uVar2 = base[5];
        base[5] = base[6];
        base[6] = uVar2;
      }
    default:
      goto switchD_002cf00f_default;
    }
    iVar3 = PAL_wcscmp((char16_t *)base[3],(char16_t *)base[1]);
    if (iVar3 < 0) {
      uVar2 = base[1];
      base[1] = base[3];
      base[3] = uVar2;
    }
    iVar3 = PAL_wcscmp((char16_t *)base[2],(char16_t *)base[1]);
    if (-1 < iVar3) {
      return;
    }
    uVar2 = base[1];
    base[1] = base[2];
    base[2] = uVar2;
    return;
  }
switchD_002cf00f_default:
  return;
code_r0x002ced91:
  uVar6 = nmemb * 2 & 0xfffffffffffffff8;
  iVar3 = PAL_wcscmp(*(char16_t **)((long)base + uVar6),(char16_t *)*base);
  if ((uVar6 != 0) && (iVar3 < 0)) {
    uVar2 = *base;
    *base = *(undefined8 *)((long)base + uVar6);
    *(undefined8 *)((long)base + uVar6) = uVar2;
  }
  uVar1 = nmemb * 8 - 8;
  uVar5 = nmemb * 6 & 0xfffffffffffffff8;
  iVar3 = PAL_wcscmp((char16_t *)base[nmemb - 1],*(char16_t **)((long)base + uVar5));
  if ((uVar5 != uVar1) && (iVar3 < 0)) {
    uVar2 = *(undefined8 *)((long)base + uVar5);
    *(undefined8 *)((long)base + uVar5) = base[nmemb - 1];
    base[nmemb - 1] = uVar2;
  }
  uVar4 = nmemb * 4 & 0xfffffffffffffff8;
  iVar3 = PAL_wcscmp((char16_t *)base[nmemb - 1],*(char16_t **)((long)base + uVar4));
  if ((uVar4 != uVar1) && (iVar3 < 0)) {
    uVar2 = *(undefined8 *)((long)base + uVar4);
    *(undefined8 *)((long)base + uVar4) = base[nmemb - 1];
    base[nmemb - 1] = uVar2;
  }
  iVar3 = PAL_wcscmp(*(char16_t **)((long)base + uVar5),*(char16_t **)((long)base + uVar4));
  if ((uVar4 != uVar5) && (iVar3 < 0)) {
    uVar2 = *(undefined8 *)((long)base + uVar4);
    *(undefined8 *)((long)base + uVar4) = *(undefined8 *)((long)base + uVar5);
    *(undefined8 *)((long)base + uVar5) = uVar2;
  }
  iVar3 = PAL_wcscmp(*(char16_t **)((long)base + uVar5),(char16_t *)*base);
  if ((uVar5 != 0) && (iVar3 < 0)) {
    uVar2 = *base;
    *base = *(undefined8 *)((long)base + uVar5);
    *(undefined8 *)((long)base + uVar5) = uVar2;
  }
  iVar3 = PAL_wcscmp(*(char16_t **)((long)base + uVar4),(char16_t *)*base);
  if ((uVar4 != 0) && (iVar3 < 0)) {
    uVar2 = *base;
    *base = *(undefined8 *)((long)base + uVar4);
    *(undefined8 *)((long)base + uVar4) = uVar2;
  }
  iVar3 = PAL_wcscmp((char16_t *)base[nmemb - 1],*(char16_t **)((long)base + uVar6));
  if ((uVar6 != uVar1) && (iVar3 < 0)) {
    uVar2 = *(undefined8 *)((long)base + uVar6);
    *(undefined8 *)((long)base + uVar6) = base[nmemb - 1];
    base[nmemb - 1] = uVar2;
  }
  iVar3 = PAL_wcscmp(*(char16_t **)((long)base + uVar5),*(char16_t **)((long)base + uVar6));
  if ((uVar6 != uVar5) && (iVar3 < 0)) {
    uVar2 = *(undefined8 *)((long)base + uVar6);
    *(undefined8 *)((long)base + uVar6) = *(undefined8 *)((long)base + uVar5);
    *(undefined8 *)((long)base + uVar5) = uVar2;
  }
  iVar3 = PAL_wcscmp(*(char16_t **)((long)base + uVar4),*(char16_t **)((long)base + uVar6));
  if ((uVar6 != uVar4) && (iVar3 < 0)) {
    uVar2 = *(undefined8 *)((long)base + uVar6);
    *(undefined8 *)((long)base + uVar6) = *(undefined8 *)((long)base + uVar4);
    *(undefined8 *)((long)base + uVar4) = uVar2;
  }
  if (uVar1 != uVar4) {
    uVar2 = base[nmemb - 1];
    base[nmemb - 1] = *(undefined8 *)((long)base + uVar4);
    *(undefined8 *)((long)base + uVar4) = uVar2;
  }
  if (uVar4 == 0) {
    lVar7 = 0;
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    lVar7 = 0;
    do {
      iVar3 = PAL_wcscmp(*(char16_t **)((long)base + uVar6),(char16_t *)base[nmemb - 1]);
      if (iVar3 < 1) {
        if (uVar6 != lVar7 * 8) {
          uVar2 = *(undefined8 *)((long)base + uVar6);
          *(undefined8 *)((long)base + uVar6) = base[lVar7];
          base[lVar7] = uVar2;
        }
        lVar7 = lVar7 + 1;
      }
      uVar6 = uVar6 + 8;
    } while (uVar6 < uVar4);
  }
  for (; uVar6 < uVar1; uVar6 = uVar6 + 8) {
    iVar3 = PAL_wcscmp(*(char16_t **)((long)base + uVar6),(char16_t *)base[nmemb - 1]);
    if (iVar3 < 0) {
      if (uVar6 != lVar7 * 8) {
        uVar2 = *(undefined8 *)((long)base + uVar6);
        *(undefined8 *)((long)base + uVar6) = base[lVar7];
        base[lVar7] = uVar2;
      }
      lVar7 = lVar7 + 1;
    }
  }
  if (lVar7 * 8 - uVar1 != 0) {
    uVar2 = base[lVar7];
    base[lVar7] = base[nmemb - 1];
    base[nmemb - 1] = uVar2;
  }
  Sort(base,lVar7);
  base = base + lVar7 + 1;
  nmemb = nmemb - (lVar7 + 1);
  goto LAB_002ced7e;
}

Assistant:

static void Sort(T* base, size_t nmemb, size_t size, Comparer comparer, void* context)
        {
            if (!base)
            {
                return;
            }

            if (nmemb <= 9) // use sorting networks for members <= 2^3
            {
                switch(nmemb)
                {
                    case 9:
                        CCQ_SORT9()
                        break;
                    case 8:
                        CCQ_SORT8()
                        break;
                    case 7:
                        CCQ_SORT7()
                        break;
                    case 6:
                        CCQ_SORT6()
                        break;
                    case 5:
                        CCQ_SORT5(0, 1, 2, 3, 4)
                        break;
                    case 4:
                        CCQ_SORT4()
                        break;
                    case 3:
                        CCQ_SORT3()
                        break;
                    case 2:
                        CCQ_SORT2(0, 1)
                        break;
                    default:
                        break; // nothing to sort
                }

                return;
            }

            CCQ_SORT5(0, (nmemb / 4), (nmemb / 2), ((3 * nmemb) / 4), (nmemb - 1));
            // guess the median is in the middle now.
            size_t pos = 0;
            const size_t pivot = (nmemb - 1) * size;
            // make last element the median(pivot)
            CCQ_SWAP(base + pivot, base + ((nmemb / 2) * size), size);

            // standard qsort pt. below
            size_t i = 0;
            for (; i < nmemb / 2 * size; i+= size)
            {
                // During the first half, count equal values as below the pivot
                if (comparer(context, base + i, base + pivot) <= 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            for (; i < pivot; i+= size)
            {
                // During the second half, count equal values as above the pivot
                if (comparer(context, base + i, base + pivot) < 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            // issue the last change
            CCQ_SWAP(base + (pos * size), base + pivot, size);

            Sort(base, pos++, size, comparer, context);
            Sort(base + (pos * size), nmemb - pos, size, comparer, context);
        }